

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glcShaderRenderCase.cpp
# Opt level: O2

void __thiscall
deqp::ShaderRenderCase::computeVertexReference
          (ShaderRenderCase *this,Surface *result,QuadGrid *quadGrid)

{
  uint uVar1;
  pointer pVVar2;
  int iVar3;
  uint uVar4;
  bool bVar5;
  Vector<float,_4> *a;
  ulong uVar6;
  int iVar7;
  float fVar8;
  int iVar9;
  RGBA RVar10;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  uint uVar11;
  int x;
  float fVar12;
  ulong uVar13;
  Vector<float,_4> *b;
  long lVar14;
  int iy;
  Vector<float,_4> *a_00;
  int ix;
  uint uVar15;
  int iVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  undefined1 auVar22 [12];
  undefined1 auVar23 [12];
  float fVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  float fVar28;
  float fVar29;
  uint in_XMM2_Dc;
  Vector<float,_4> VVar30;
  Vec4 color;
  vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> colors;
  Vec4 color_1;
  Vec4 c11;
  Vec4 c10;
  Vec4 c01;
  ShaderEvalContext evalCtx;
  float local_394;
  Vector<float,_4> local_340;
  _Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> local_330;
  undefined1 local_318 [16];
  float local_308;
  undefined4 uStack_304;
  undefined4 uStack_300;
  undefined4 uStack_2fc;
  undefined1 local_2f8 [16];
  ulong local_2e8;
  ulong local_2e0;
  ulong local_2d8;
  Vec4 local_2d0;
  Vector<float,_4> local_2c0;
  Vector<float,_4> local_2b0;
  Vector<float,_4> local_2a0;
  Vector<float,_4> local_290;
  Vector<float,_4> local_280;
  Vector<float,_4> local_270;
  Vector<float,_4> local_260;
  Vector<float,_4> local_250;
  ShaderEvalContext local_240;
  
  local_318._0_4_ = result->m_width;
  iVar3 = result->m_height;
  uVar4 = quadGrid->m_gridSize;
  fVar12 = (float)(uVar4 + 1);
  iVar7 = (*this->m_renderCtx->_vptr_RenderContext[4])();
  iVar7 = *(int *)(CONCAT44(extraout_var,iVar7) + 0x14);
  ShaderEvalContext::ShaderEvalContext(&local_240,quadGrid);
  std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::vector
            ((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)&local_330,
             (long)((int)fVar12 * (int)fVar12),(allocator_type *)&local_340);
  fVar17 = (float)(int)uVar4;
  lVar14 = 0;
  local_308 = 0.0;
  if (0 < (int)fVar12) {
    local_308 = fVar12;
  }
  fVar8 = 0.0;
  while (fVar8 != local_308) {
    local_2f8._0_4_ = fVar8;
    for (uVar13 = 0; (uint)fVar12 != uVar13; uVar13 = uVar13 + 1) {
      ShaderEvalContext::reset(&local_240,(float)(int)uVar13 / fVar17,(float)(int)fVar8 / fVar17);
      (*this->m_evaluator->_vptr_ShaderEvaluator[2])(this->m_evaluator,&local_240);
      tcu::Vector<float,_4>::Vector(&local_340,&local_240.color);
      if (iVar7 < 1) {
        local_340.m_data[3] = 1.0;
      }
      pVVar2 = local_330._M_impl.super__Vector_impl_data._M_start + ((int)lVar14 + (int)uVar13);
      pVVar2->m_data[0] = local_340.m_data[0];
      pVVar2->m_data[1] = local_340.m_data[1];
      pVVar2->m_data[2] = local_340.m_data[2];
      pVVar2->m_data[3] = local_340.m_data[3];
    }
    lVar14 = lVar14 + (ulong)(uint)fVar12;
    fVar8 = (float)(local_2f8._0_4_ + 1);
  }
  fVar8 = (float)(int)local_318._0_4_;
  uVar15 = 0;
  uVar11 = 0;
  if (0 < (int)uVar4) {
    uVar11 = uVar4;
  }
  while (uVar15 != uVar11) {
    uVar1 = uVar15 + 1;
    fVar26 = ((float)(int)uVar15 / fVar17) * (float)iVar3;
    fVar24 = ((float)(int)uVar1 / fVar17) * (float)iVar3;
    fVar18 = ceilf(fVar26 + -0.5);
    fVar19 = ceilf(fVar24 + -0.5);
    local_2e8 = (ulong)(uVar15 * (int)fVar12);
    local_2e0 = (ulong)(uVar1 * (int)fVar12);
    uVar13 = 0;
    while (uVar6 = local_2e8, uVar15 = uVar1, uVar13 != uVar4) {
      iVar16 = (int)uVar13;
      local_2d8 = uVar13 + 1;
      fVar27 = ((float)iVar16 / fVar17) * fVar8;
      fVar25 = ((float)(int)local_2d8 / fVar17) * fVar8;
      fVar20 = ceilf(fVar27 + -0.5);
      fVar21 = ceilf(fVar25 + -0.5);
      iVar7 = (int)local_2e0;
      tcu::Vector<float,_4>::Vector
                (&local_340,
                 local_330._M_impl.super__Vector_impl_data._M_start + ((int)uVar6 + iVar16));
      tcu::Vector<float,_4>::Vector
                (&local_250,
                 local_330._M_impl.super__Vector_impl_data._M_start + ((int)uVar6 + iVar16 + 1));
      tcu::Vector<float,_4>::Vector
                (&local_260,local_330._M_impl.super__Vector_impl_data._M_start + (iVar7 + iVar16));
      tcu::Vector<float,_4>::Vector
                (&local_270,
                 local_330._M_impl.super__Vector_impl_data._M_start + (iVar7 + iVar16 + 1));
      for (iVar7 = (int)fVar18; uVar13 = local_2d8, iVar7 < (int)fVar19; iVar7 = iVar7 + 1) {
        fVar28 = (((float)iVar7 + 0.5) - fVar26) * (1.0 / (fVar24 - fVar26));
        auVar22 = ZEXT812(0x3f800000);
        if (fVar28 <= 1.0) {
          auVar22._4_8_ = 0;
          auVar22._0_4_ = fVar28;
        }
        fVar28 = (float)(-(uint)(0.0 < fVar28) & auVar22._0_4_);
        in_XMM2_Dc = in_XMM2_Dc & auVar22._8_4_;
        local_318._4_4_ = 0;
        local_318._0_4_ = fVar28;
        local_318._8_4_ = in_XMM2_Dc;
        local_318._12_4_ = 0;
        for (iVar16 = (int)fVar20; iVar16 < (int)fVar21; iVar16 = iVar16 + 1) {
          fVar29 = (((float)iVar16 + 0.5) - fVar27) * (1.0 / (fVar25 - fVar27));
          auVar23 = ZEXT812(0x3f800000);
          if (fVar29 <= 1.0) {
            auVar23._4_8_ = 0;
            auVar23._0_4_ = fVar29;
          }
          local_308 = (float)(-(uint)(0.0 < fVar29) & auVar23._0_4_);
          local_2f8._4_4_ = 0;
          local_2f8._0_4_ = local_308;
          local_2f8._8_4_ = in_XMM2_Dc & auVar23._8_4_;
          local_2f8._12_4_ = 0;
          local_308 = (float)local_318._0_4_ + local_308;
          uStack_304 = local_318._4_4_;
          uStack_300 = local_318._8_4_;
          uStack_2fc = local_318._12_4_;
          bVar5 = 1.0 < local_308;
          local_394 = (float)local_318._0_4_;
          if (bVar5) {
            local_394 = 1.0 - fVar28;
          }
          b = &local_270;
          if (!bVar5) {
            b = &local_340;
          }
          a_00 = &local_250;
          a = &local_260;
          if (!bVar5) {
            a_00 = &local_260;
            a = &local_250;
          }
          tcu::operator-((tcu *)&local_2a0,a,b);
          in_XMM2_Dc = local_2f8._8_4_;
          tcu::operator*((tcu *)&local_290,
                         (float)(-(uint)(local_308 <= 1.0) & local_2f8._0_4_ |
                                ~-(uint)(local_308 <= 1.0) & (uint)(1.0 - (float)local_2f8._0_4_)),
                         &local_2a0);
          tcu::operator+((tcu *)&local_280,b,&local_290);
          tcu::operator-((tcu *)&local_2c0,a_00,b);
          tcu::operator*((tcu *)&local_2b0,local_394,&local_2c0);
          VVar30 = tcu::operator+((tcu *)&local_2d0,&local_280,&local_2b0);
          iVar9 = (*this->m_renderCtx->_vptr_RenderContext[4])(VVar30.m_data._0_8_,VVar30.m_data[2])
          ;
          if (*(int *)(CONCAT44(extraout_var_00,iVar9) + 0x14) == 1) {
            local_2d0.m_data[3] = floorf(local_2d0.m_data[3] + 0.5);
          }
          RVar10 = toRGBA(&local_2d0);
          *(deUint32 *)
           ((long)(result->m_pixels).m_ptr + (long)(result->m_width * iVar7 + iVar16) * 4) =
               RVar10.m_value;
        }
      }
    }
  }
  std::_Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::~_Vector_base
            (&local_330);
  return;
}

Assistant:

void ShaderRenderCase::computeVertexReference(Surface& result, const QuadGrid& quadGrid)
{
	// Buffer info.
	int				  width	= result.getWidth();
	int				  height   = result.getHeight();
	int				  gridSize = quadGrid.getGridSize();
	int				  stride   = gridSize + 1;
	bool			  hasAlpha = m_renderCtx.getRenderTarget().getPixelFormat().alphaBits > 0;
	ShaderEvalContext evalCtx(quadGrid);

	// Evaluate color for each vertex.
	vector<Vec4> colors((gridSize + 1) * (gridSize + 1));
	for (int y = 0; y < gridSize + 1; y++)
		for (int x = 0; x < gridSize + 1; x++)
		{
			float sx	 = static_cast<float>(x) / static_cast<float>(gridSize);
			float sy	 = static_cast<float>(y) / static_cast<float>(gridSize);
			int   vtxNdx = ((y * (gridSize + 1)) + x);

			evalCtx.reset(sx, sy);
			m_evaluator.evaluate(evalCtx);
			DE_ASSERT(!evalCtx.isDiscarded); // Discard is not available in vertex shader.
			Vec4 color = evalCtx.color;

			if (!hasAlpha)
				color.w() = 1.0f;

			colors[vtxNdx] = color;
		}

	// Render quads.
	for (int y = 0; y < gridSize; y++)
		for (int x = 0; x < gridSize; x++)
		{
			float x0 = static_cast<float>(x) / static_cast<float>(gridSize);
			float x1 = static_cast<float>(x + 1) / static_cast<float>(gridSize);
			float y0 = static_cast<float>(y) / static_cast<float>(gridSize);
			float y1 = static_cast<float>(y + 1) / static_cast<float>(gridSize);

			float sx0  = x0 * (float)width;
			float sx1  = x1 * (float)width;
			float sy0  = y0 * (float)height;
			float sy1  = y1 * (float)height;
			float oosx = 1.0f / (sx1 - sx0);
			float oosy = 1.0f / (sy1 - sy0);

			int ix0 = deCeilFloatToInt32(sx0 - 0.5f);
			int ix1 = deCeilFloatToInt32(sx1 - 0.5f);
			int iy0 = deCeilFloatToInt32(sy0 - 0.5f);
			int iy1 = deCeilFloatToInt32(sy1 - 0.5f);

			int  v00 = (y * stride) + x;
			int  v01 = (y * stride) + x + 1;
			int  v10 = ((y + 1) * stride) + x;
			int  v11 = ((y + 1) * stride) + x + 1;
			Vec4 c00 = colors[v00];
			Vec4 c01 = colors[v01];
			Vec4 c10 = colors[v10];
			Vec4 c11 = colors[v11];

			//printf("(%d,%d) -> (%f..%f, %f..%f) (%d..%d, %d..%d)\n", x, y, sx0, sx1, sy0, sy1, ix0, ix1, iy0, iy1);

			for (int iy = iy0; iy < iy1; iy++)
				for (int ix = ix0; ix < ix1; ix++)
				{
					DE_ASSERT(deInBounds32(ix, 0, width));
					DE_ASSERT(deInBounds32(iy, 0, height));

					float sfx = (float)ix + 0.5f;
					float sfy = (float)iy + 0.5f;
					float fx1 = deFloatClamp((sfx - sx0) * oosx, 0.0f, 1.0f);
					float fy1 = deFloatClamp((sfy - sy0) * oosy, 0.0f, 1.0f);

					// Triangle quad interpolation.
					bool		tri   = fx1 + fy1 <= 1.0f;
					float		tx	= tri ? fx1 : (1.0f - fx1);
					float		ty	= tri ? fy1 : (1.0f - fy1);
					const Vec4& t0	= tri ? c00 : c11;
					const Vec4& t1	= tri ? c01 : c10;
					const Vec4& t2	= tri ? c10 : c01;
					Vec4		color = t0 + (t1 - t0) * tx + (t2 - t0) * ty;

					// Quantizing for 1-bit alpha
					if ((m_renderCtx.getRenderTarget().getPixelFormat().alphaBits) == 1)
						color.w() = deFloatRound(color.w());

					result.setPixel(ix, iy, toRGBA(color));
				}
		}
}